

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test
::TestBody(MatchingTest_MatchesAppearInPostTraversalOrderForMovedFields_Test *this)

{
  FieldDescriptor *this_00;
  Descriptor *pDVar1;
  FieldDescriptor *this_01;
  FieldDescriptor *field;
  void *pvVar2;
  void *pvVar3;
  char *message;
  undefined1 in_R9B;
  RepeatedField<int> *pRVar4;
  Metadata MVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  AssertHelper AStack_378;
  internal local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  string local_360;
  undefined1 local_340 [184];
  undefined1 local_288 [184];
  MessageDifferencer local_1d0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_288,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_340,(Arena *)0x0);
  MVar5 = proto2_unittest::TestDiffMessage::GetMetadata
                    ((TestDiffMessage *)proto2_unittest::_TestDiffMessage_default_instance_);
  name._M_str = "item";
  name._M_len = 4;
  this_00 = Descriptor::FindFieldByName(MVar5.descriptor,name);
  pDVar1 = FieldDescriptor::message_type(this_00);
  name_00._M_str = "rm";
  name_00._M_len = 2;
  this_01 = Descriptor::FindFieldByName(pDVar1,name_00);
  pDVar1 = FieldDescriptor::message_type(this_01);
  name_01._M_str = "rc";
  name_01._M_len = 2;
  field = Descriptor::FindFieldByName(pDVar1,name_01);
  util::MessageDifferencer::MessageDifferencer(&local_1d0);
  util::MessageDifferencer::TreatAsSet(&local_1d0,this_00);
  util::MessageDifferencer::TreatAsSet(&local_1d0,this_01);
  util::MessageDifferencer::TreatAsSet(&local_1d0,field);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_288 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 1;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),2);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar3 + 0x18),3);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 4;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar2 + 0x18);
  RepeatedField<int>::Add(pRVar4,5);
  RepeatedField<int>::Add(pRVar4,6);
  RepeatedField<int>::Add(pRVar4,7);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_340 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pvVar3 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar3 + 0x48) = 4;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar3 + 0x18);
  RepeatedField<int>::Add(pRVar4,7);
  RepeatedField<int>::Add(pRVar4,6);
  RepeatedField<int>::Add(pRVar4,5);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 1;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),3);
  RepeatedField<int>::Add((RepeatedField<int> *)((long)pvVar2 + 0x18),2);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_288 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 8;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar2 + 0x18);
  RepeatedField<int>::Add(pRVar4,10);
  RepeatedField<int>::Add(pRVar4,0xb);
  RepeatedField<int>::Add(pRVar4,9);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(local_340 + 0x30),
                      Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  pvVar2 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar2 + 0x40),
                      Arena::DefaultConstruct<proto2_unittest::TestField>);
  *(undefined4 *)((long)pvVar2 + 0x48) = 8;
  *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 2;
  pRVar4 = (RepeatedField<int> *)((long)pvVar2 + 0x18);
  RepeatedField<int>::Add(pRVar4,9);
  RepeatedField<int>::Add(pRVar4,10);
  RepeatedField<int>::Add(pRVar4,0xb);
  protobuf::(anonymous_namespace)::MatchingTest::RunWithResult_abi_cxx11_
            (&local_360,&local_1d0,(MessageDifferencer *)local_288,(Message *)local_340,
             (Message *)0x1,(bool)in_R9B);
  testing::internal::CmpHelperEQ<char[876],std::__cxx11::string>
            (local_370,
             "\"matched: item[0].rm[0].c -> item[0].rm[1].c : 1\\n\" \"moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\\n\" \"moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\\n\" \"moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\\n\" \"matched: item[0].rm[1].c -> item[0].rm[0].c : 4\\n\" \"moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\\n\" \"matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\\n\" \"moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\\n\" \"moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\\n\" \"matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }\" \" rm { c: 4 rc: 5 rc: 6 rc: 7 } }\\n\" \"matched: item[1].rm[0].c : 8\\n\" \"moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\\n\" \"moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\\n\" \"moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\\n\" \"matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\\n\" \"matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\\n\""
             ,"RunWithResult(&differencer, msg1, msg2, true)",
             (char (*) [876])
             "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\nmoved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\nmoved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\nmoved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\nmatched: item[0].rm[1].c -> item[0].rm[0].c : 4\nmoved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\nmatched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\nmoved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\nmoved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\nmatched: item[0] : { rm { c: 1 rc: 2 rc: 3 } rm { c: 4 rc: 5 rc: 6 rc: 7 } }\nmatched: item[1].rm[0].c : 8\nmoved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\nmoved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\nmoved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\nmatched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\nmatched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n"
             ,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_360);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x1021,message);
    testing::internal::AssertHelper::operator=(&AStack_378,(Message *)&local_360);
    testing::internal::AssertHelper::~AssertHelper(&AStack_378);
    if ((long *)local_360._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_360._M_dataplus._M_p + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_368,local_368);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1d0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_340);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_288);
  return;
}

Assistant:

TEST_F(MatchingTest, MatchesAppearInPostTraversalOrderForMovedFields) {
  proto2_unittest::TestDiffMessage msg1, msg2;
  proto2_unittest::TestDiffMessage::Item* item;
  proto2_unittest::TestField* field;

  const FieldDescriptor* desc;
  const FieldDescriptor* nested_desc;
  const FieldDescriptor* double_nested_desc;
  desc = msg1.GetDescriptor()->FindFieldByName("item");
  nested_desc = desc->message_type()->FindFieldByName("rm");
  double_nested_desc = nested_desc->message_type()->FindFieldByName("rc");
  MessageDifferencer differencer;
  differencer.TreatAsSet(desc);
  differencer.TreatAsSet(nested_desc);
  differencer.TreatAsSet(double_nested_desc);

  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(2);
  field->add_rc(3);
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(5);
  field->add_rc(6);
  field->add_rc(7);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(4);
  field->add_rc(7);
  field->add_rc(6);
  field->add_rc(5);
  field = item->add_rm();
  field->set_c(1);
  field->add_rc(3);
  field->add_rc(2);
  item = msg1.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(10);
  field->add_rc(11);
  field->add_rc(9);
  item = msg2.add_item();
  field = item->add_rm();
  field->set_c(8);
  field->add_rc(9);
  field->add_rc(10);
  field->add_rc(11);

  EXPECT_EQ(
      "matched: item[0].rm[0].c -> item[0].rm[1].c : 1\n"
      "moved: item[0].rm[0].rc[0] -> item[0].rm[1].rc[1] : 2\n"
      "moved: item[0].rm[0].rc[1] -> item[0].rm[1].rc[0] : 3\n"
      "moved: item[0].rm[0] -> item[0].rm[1] : { c: 1 rc: 2 rc: 3 }\n"
      "matched: item[0].rm[1].c -> item[0].rm[0].c : 4\n"
      "moved: item[0].rm[1].rc[0] -> item[0].rm[0].rc[2] : 5\n"
      "matched: item[0].rm[1].rc[1] -> item[0].rm[0].rc[1] : 6\n"
      "moved: item[0].rm[1].rc[2] -> item[0].rm[0].rc[0] : 7\n"
      "moved: item[0].rm[1] -> item[0].rm[0] : { c: 4 rc: 5 rc: 6 rc: 7 }\n"
      "matched: item[0] : { rm { c: 1 rc: 2 rc: 3 }"
      " rm { c: 4 rc: 5 rc: 6 rc: 7 } }\n"
      "matched: item[1].rm[0].c : 8\n"
      "moved: item[1].rm[0].rc[0] -> item[1].rm[0].rc[1] : 10\n"
      "moved: item[1].rm[0].rc[1] -> item[1].rm[0].rc[2] : 11\n"
      "moved: item[1].rm[0].rc[2] -> item[1].rm[0].rc[0] : 9\n"
      "matched: item[1].rm[0] : { c: 8 rc: 10 rc: 11 rc: 9 }\n"
      "matched: item[1] : { rm { c: 8 rc: 10 rc: 11 rc: 9 } }\n",
      RunWithResult(&differencer, msg1, msg2, true));
}